

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_sampling_superalphabet_vector(uchar **strings,size_t n)

{
  uchar *ptr;
  bool bVar1;
  uint16_t uVar2;
  ushort uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar6;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar7;
  pointer in_RCX;
  size_t sVar8;
  size_t depth;
  long lVar9;
  BurstSimple<unsigned_short> local_51;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
  *local_50;
  uchar **local_48;
  pointer local_40;
  uchar *str;
  
  local_48 = strings;
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"pseudo_sample");
  poVar4 = std::operator<<(poVar4,"(): sampling ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," strings ...\n");
  local_50 = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              *)operator_new(0x18);
  (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 2000;
  for (local_40 = (pointer)0x0; local_40 < n; local_40 = local_40 + 0x400) {
    ptr = local_48[(long)local_40];
    sVar8 = 0;
    in_RCX = local_40;
    pTVar6 = local_50;
    while( true ) {
      uVar2 = get_char<unsigned_short>(ptr,sVar8);
      if ((char)uVar2 == '\0') break;
      TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::
      extend(pTVar6,uVar2 + 1);
      bVar1 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              ::is_trie(pTVar6,(uint)uVar2);
      if (!bVar1) {
        puVar5 = (undefined8 *)operator_new(0x18);
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar5[2] = 0;
        in_RCX = (pTVar6->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 **)((long)in_RCX + (ulong)((uint)uVar2 * 8)) = puVar5;
        make_trie((void **)((ulong)((uint)uVar2 * 8) +
                           (long)(pTVar6->_buckets).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_start));
        lVar9 = lVar9 + -1;
        if (lVar9 == 0) goto LAB_001effa1;
      }
      pTVar6 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_node(pTVar6,(uint)uVar2);
      sVar8 = sVar8 + 2;
      if (pTVar6 == (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                     *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                     );
      }
    }
  }
LAB_001effa1:
  sVar8 = 0;
  do {
    if (sVar8 == n) {
      traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                (local_50,local_48,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
      return;
    }
    str = local_48[sVar8];
    uVar3 = get_char<unsigned_short>(str,0);
    depth = 2;
    pTVar6 = local_50;
    while( true ) {
      bVar1 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              ::is_trie(pTVar6,(uint)uVar3);
      if (!bVar1) break;
      if ((char)uVar3 == '\0') {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xeb,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      pTVar6 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_node(pTVar6,(uint)uVar3);
      uVar3 = get_char<unsigned_short>(str,depth);
      depth = depth + 2;
    }
    this = &TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
            ::get_bucket(pTVar6,(uint)uVar3)->
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>;
    if (this == (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      __assert_fail("bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0xf1,
                    "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                   );
    }
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this,&str);
    if (((char)uVar3 != '\0') &&
       (0x20000 < (ulong)((long)(this->_M_impl).super__Vector_impl_data._M_finish -
                         (long)(this->_M_impl).super__Vector_impl_data._M_start))) {
      pTVar7 = BurstSimple<unsigned_short>::operator()
                         (&local_51,
                          (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this,depth);
      in_RCX = (pTVar6->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_RCX[uVar3] = pTVar7;
      make_trie((pTVar6->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + uVar3);
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this);
      operator_delete(this);
    }
    sVar8 = sVar8 + 1;
  } while( true );
}

Assistant:

void burstsort2_sampling_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}